

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_slice.c
# Opt level: O2

int h264_slice_data(bitstream *str,h264_slice *slice)

{
  vs_dir vVar1;
  h264_cabac_context *phVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  h264_cabac_context *cabac;
  h264_macroblock *phVar9;
  h264_macroblock *phVar10;
  uint uVar11;
  bool bVar12;
  uint32_t local_44;
  uint32_t mb_skip_flag;
  uint32_t end_of_slice_flag;
  h264_cabac_context *local_38;
  
  slice->prev_mb_addr = 0xffffffff;
  uVar3 = (slice->mbaff_frame_flag + 1) * slice->first_mb_in_slice;
  slice->curr_mb_addr = uVar3;
  if (str->dir == VS_DECODE) {
    slice->last_mb_in_slice = uVar3;
  }
  uVar3 = 0x20;
  if (slice->slice_type == 1) {
    uVar3 = 0x38;
  }
  if (slice->picparm->entropy_coding_mode_flag == 0) {
    uVar11 = 1;
    do {
      local_44 = 0;
      if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
LAB_00103c4f:
        uVar7 = slice->curr_mb_addr;
        if (slice->pic_size_in_mbs <= uVar7) goto LAB_00104000;
        if (slice->mbaff_frame_flag == 0) {
          phVar10 = slice->mbs + uVar7;
          uVar8 = slice->field_pic_flag;
LAB_00103ce3:
          iVar4 = vs_infer(str,&phVar10->mb_field_decoding_flag,uVar8);
        }
        else {
          uVar5 = uVar7 & 0xfffffffe;
          phVar9 = slice->mbs;
          if (uVar7 != uVar5) {
            if (phVar9[uVar5].mb_type == uVar3) {
              iVar4 = h264_mb_field_decoding_flag
                                (str,(h264_cabac_context *)0x0,&phVar9[uVar5].mb_field_decoding_flag
                                );
              if (iVar4 != 0) {
                return 1;
              }
              phVar9 = slice->mbs;
            }
            phVar10 = phVar9 + (uVar7 | 1);
            uVar8 = phVar9[uVar5].mb_field_decoding_flag;
            goto LAB_00103ce3;
          }
          iVar4 = h264_mb_field_decoding_flag
                            (str,(h264_cabac_context *)0x0,&phVar9[uVar7].mb_field_decoding_flag);
        }
        if (iVar4 != 0) {
          return 1;
        }
        iVar4 = h264_macroblock_layer
                          (str,(h264_cabac_context *)0x0,slice,slice->mbs + slice->curr_mb_addr);
        if (iVar4 != 0) {
          return 1;
        }
        if (str->dir == VS_ENCODE) {
          uVar8 = slice->curr_mb_addr;
          if (slice->last_mb_in_slice == uVar8) goto LAB_00103da1;
          slice->prev_mb_addr = uVar8;
        }
        else {
          slice->last_mb_in_slice = slice->curr_mb_addr;
          iVar4 = vs_has_more_data(str);
          if (iVar4 == -1) {
            return 1;
          }
          if (iVar4 == 0) goto LAB_00103da1;
          uVar8 = slice->curr_mb_addr;
          vVar1 = str->dir;
          slice->prev_mb_addr = uVar8;
          if (vVar1 == VS_DECODE) {
            slice->last_mb_in_slice = uVar8;
          }
        }
        uVar8 = h264_next_mb_addr(slice,uVar8);
        slice->curr_mb_addr = uVar8;
        uVar7 = 0;
        if (slice->pic_size_in_mbs <= uVar8) goto LAB_00104000;
      }
      else {
        if (str->dir != VS_ENCODE) {
          iVar4 = vs_ue(str,&local_44);
          if (iVar4 != 0) {
            return 1;
          }
          while (bVar12 = local_44 != 0, local_44 = local_44 - 1, bVar12) {
            uVar7 = slice->curr_mb_addr;
            if (slice->pic_size_in_mbs <= uVar7) goto LAB_00104000;
            slice->last_mb_in_slice = uVar7;
            phVar10 = slice->mbs;
            phVar10[uVar7].mb_type = uVar3;
            iVar4 = infer_skip(str,slice,phVar10 + uVar7);
            if (iVar4 != 0) {
              return 1;
            }
            uVar8 = slice->curr_mb_addr;
            slice->prev_mb_addr = uVar8;
            slice->last_mb_in_slice = uVar8;
            uVar8 = h264_next_mb_addr(slice,uVar8);
            slice->curr_mb_addr = uVar8;
          }
          iVar4 = vs_has_more_data(str);
          if (iVar4 == -1) {
            return 1;
          }
          if (iVar4 != 0) goto LAB_00103c4f;
          goto LAB_00103da1;
        }
        uVar7 = slice->curr_mb_addr;
        while( true ) {
          uVar8 = slice->mbs[uVar7].mb_type;
          if (uVar8 != uVar3) break;
          local_44 = local_44 + 1;
          iVar4 = infer_skip(str,slice,slice->mbs + uVar7);
          if (iVar4 != 0) {
            return 1;
          }
          uVar6 = slice->curr_mb_addr;
          if (uVar6 == slice->last_mb_in_slice) break;
          slice->prev_mb_addr = uVar6;
          uVar7 = h264_next_mb_addr(slice,uVar6);
          slice->curr_mb_addr = uVar7;
        }
        iVar4 = vs_ue(str,&local_44);
        uVar7 = 8;
        if (iVar4 != 0) {
          uVar7 = uVar11;
        }
        if (iVar4 == 0 && uVar8 != uVar3) goto LAB_00103c4f;
      }
    } while (uVar7 == 0);
    if (uVar7 == 8) {
LAB_00103da1:
      iVar4 = vs_end(str);
      uVar11 = (uint)(iVar4 != 0);
    }
  }
  else {
    uVar11 = 1;
    iVar4 = vs_align_byte(str,VS_ALIGN_1);
    if (iVar4 == 0) {
      cabac = h264_cabac_new(slice);
      iVar4 = h264_cabac_init_arith(str,cabac);
      phVar2 = cabac;
      if (iVar4 == 0) {
        do {
          local_38 = phVar2;
          mb_skip_flag = 0;
          if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
LAB_00103ea0:
            if (slice->mbaff_frame_flag == 0) {
              iVar4 = vs_infer(str,&slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag,
                               slice->field_pic_flag);
            }
            else {
              uVar11 = slice->curr_mb_addr;
              uVar7 = uVar11 & 0xfffffffe;
              phVar10 = slice->mbs;
              if (uVar11 == uVar7) {
                iVar4 = h264_mb_field_decoding_flag
                                  (str,cabac,&phVar10[uVar11].mb_field_decoding_flag);
              }
              else {
                if (phVar10[uVar7].mb_type == uVar3) {
                  iVar4 = h264_mb_field_decoding_flag
                                    (str,cabac,&phVar10[uVar7].mb_field_decoding_flag);
                  if (iVar4 != 0) {
LAB_00104021:
                    h264_cabac_destroy(cabac);
                    return 1;
                  }
                  phVar10 = slice->mbs;
                }
                iVar4 = vs_infer(str,&phVar10[uVar11 | 1].mb_field_decoding_flag,
                                 phVar10[uVar7].mb_field_decoding_flag);
              }
            }
            if (iVar4 != 0) goto LAB_00103aee;
            iVar4 = h264_macroblock_layer(str,cabac,slice,slice->mbs + slice->curr_mb_addr);
          }
          else {
            phVar10 = slice->mbs;
            uVar11 = slice->curr_mb_addr;
            if (str->dir == VS_ENCODE) {
              mb_skip_flag = (uint32_t)(phVar10[uVar11].mb_type == uVar3);
            }
            uVar8 = phVar10[uVar11].mb_field_decoding_flag;
            if ((((uVar11 & 1) == 0) || (slice->mbaff_frame_flag == 0)) ||
               (phVar10[uVar11 - 1].mb_type == uVar3)) {
              uVar6 = inferred_mb_field_decoding_flag(slice);
            }
            else {
              uVar6 = phVar10[uVar11 - 1].mb_field_decoding_flag;
            }
            cabac = local_38;
            phVar10[uVar11].mb_field_decoding_flag = uVar6;
            iVar4 = h264_mb_skip_flag(str,local_38,&mb_skip_flag);
            if (iVar4 != 0) goto LAB_00104021;
            phVar10 = slice->mbs;
            uVar11 = slice->curr_mb_addr;
            phVar10[uVar11].mb_field_decoding_flag = uVar8;
            if (mb_skip_flag == 0) goto LAB_00103ea0;
            iVar4 = infer_skip(str,slice,phVar10 + uVar11);
          }
          if (iVar4 != 0) goto LAB_00103aee;
          uVar11 = slice->curr_mb_addr;
          if (slice->mbaff_frame_flag == 0 || (uVar11 & 1) != 0) {
            end_of_slice_flag = (uint32_t)(slice->last_mb_in_slice == uVar11);
            iVar4 = h264_cabac_terminate(str,cabac,&end_of_slice_flag);
            if (iVar4 != 0) goto LAB_00103aee;
            if (end_of_slice_flag != 0) {
              slice->last_mb_in_slice = slice->curr_mb_addr;
              h264_cabac_destroy(cabac);
              iVar4 = vs_align_byte(str,VS_ALIGN_0);
              return iVar4;
            }
            uVar11 = slice->curr_mb_addr;
          }
          slice->prev_mb_addr = uVar11;
          if (str->dir == VS_DECODE) {
            slice->last_mb_in_slice = uVar11;
          }
          uVar8 = h264_next_mb_addr(slice,uVar11);
          slice->curr_mb_addr = uVar8;
          phVar2 = local_38;
        } while (uVar8 < slice->pic_size_in_mbs);
LAB_00104000:
        uVar11 = 1;
        fwrite("MB index out of range!\n",0x17,1,_stderr);
      }
      else {
LAB_00103aee:
        uVar11 = 1;
        h264_cabac_destroy(cabac);
      }
    }
  }
  return uVar11;
}

Assistant:

int h264_slice_data(struct bitstream *str, struct h264_slice *slice) {
	slice->prev_mb_addr = -1;
	slice->curr_mb_addr = slice->first_mb_in_slice * (1 + slice->mbaff_frame_flag);
	if (str->dir == VS_DECODE)
		slice->last_mb_in_slice = slice->curr_mb_addr;
	uint32_t skip_type = (slice->slice_type == H264_SLICE_TYPE_B ? H264_MB_TYPE_B_SKIP : H264_MB_TYPE_P_SKIP);
	if (slice->picparm->entropy_coding_mode_flag) {
		if (vs_align_byte(str, VS_ALIGN_1)) return 1;
		struct h264_cabac_context *cabac = h264_cabac_new(slice);
		if (h264_cabac_init_arith(str, cabac)) { h264_cabac_destroy(cabac); return 1; }
		while (1) {
			uint32_t mb_skip_flag = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_flag = slice->mbs[slice->curr_mb_addr].mb_type == skip_type;
				}
				/* mb_field_decoding_flag is decoded *after* mb_skip_flag in some circumstances, have to use an inferred value for CABAC prediction */
				int save = slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag;
				int ival;
				if (slice->mbaff_frame_flag
						&& slice->curr_mb_addr & 1
						&& slice->mbs[slice->curr_mb_addr - 1].mb_type != skip_type) {
					ival = slice->mbs[slice->curr_mb_addr - 1].mb_field_decoding_flag;
				} else {
					ival = inferred_mb_field_decoding_flag(slice);
				}
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = ival;
				if (h264_mb_skip_flag(str, cabac, &mb_skip_flag)) { h264_cabac_destroy(cabac); return 1; }
				slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag = save;
			}
			if (mb_skip_flag) {
				if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			} else {
				if (slice->mbaff_frame_flag) {
					uint32_t first_addr = slice->curr_mb_addr & ~1;
					if (slice->curr_mb_addr == first_addr) {
						if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					} else {
						if (slice->mbs[first_addr].mb_type == skip_type) {
							if (h264_mb_field_decoding_flag(str, cabac, &slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
						}
						if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) { h264_cabac_destroy(cabac); return 1; }
					}
				} else {
					if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) { h264_cabac_destroy(cabac); return 1; }
				}
				if (h264_macroblock_layer(str, cabac, slice, &slice->mbs[slice->curr_mb_addr])) { h264_cabac_destroy(cabac); return 1; }
			}
			if (!slice->mbaff_frame_flag || (slice->curr_mb_addr & 1)) {
				uint32_t end_of_slice_flag = slice->last_mb_in_slice == slice->curr_mb_addr;
				if (h264_cabac_terminate(str, cabac, &end_of_slice_flag)) { h264_cabac_destroy(cabac); return 1; }
				if (end_of_slice_flag) {
					slice->last_mb_in_slice = slice->curr_mb_addr;
					h264_cabac_destroy(cabac);
					/* XXX: cabac_zero_word crap */
					return vs_align_byte(str, VS_ALIGN_0);
				}
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
	} else {
		while (1) {
			int end = 0;
			uint32_t mb_skip_run = 0;
			if (slice->slice_type != H264_SLICE_TYPE_I && slice->slice_type != H264_SLICE_TYPE_SI) {
				if (str->dir == VS_ENCODE) {
					mb_skip_run = 0;
					while (slice->mbs[slice->curr_mb_addr].mb_type == skip_type) {
						mb_skip_run++;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						if (slice->curr_mb_addr == slice->last_mb_in_slice) {
							end = 1;
							break;
						}
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					if (vs_ue(str, &mb_skip_run)) return 1;
					if (end)
						goto out_cavlc;
				} else {
					if (vs_ue(str, &mb_skip_run)) return 1;
					while (mb_skip_run--) {
						if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
							fprintf(stderr, "MB index out of range!\n");
							return 1;
						}
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->mbs[slice->curr_mb_addr].mb_type = skip_type;
						if (infer_skip(str, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
						slice->prev_mb_addr = slice->curr_mb_addr;
						slice->last_mb_in_slice = slice->curr_mb_addr;
						slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
					}
					int more = vs_has_more_data(str);
					if (more == -1)
						return 1;
					if (more == 0)
						goto out_cavlc;
				}
			}
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
			if (slice->mbaff_frame_flag) {
				uint32_t first_addr = slice->curr_mb_addr & ~1;
				if (slice->curr_mb_addr == first_addr) {
					if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				} else {
					if (slice->mbs[first_addr].mb_type == skip_type)
						if (h264_mb_field_decoding_flag(str, 0, &slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
					if (vs_infer(str, &slice->mbs[first_addr + 1].mb_field_decoding_flag, slice->mbs[first_addr].mb_field_decoding_flag)) return 1;
				}
			} else {
				if (vs_infer(str, &slice->mbs[slice->curr_mb_addr].mb_field_decoding_flag, slice->field_pic_flag)) return 1;
			}
			if (h264_macroblock_layer(str, 0, slice, &slice->mbs[slice->curr_mb_addr])) return 1;
			if(str->dir == VS_ENCODE) {
				if (slice->last_mb_in_slice == slice->curr_mb_addr)
					goto out_cavlc;
			} else {
				slice->last_mb_in_slice = slice->curr_mb_addr;
				int more = vs_has_more_data(str);
				if (more == -1)
					return 1;
				if (more == 0)
					goto out_cavlc;
			}
			slice->prev_mb_addr = slice->curr_mb_addr;
			if (str->dir == VS_DECODE)
				slice->last_mb_in_slice = slice->curr_mb_addr;
			slice->curr_mb_addr = h264_next_mb_addr(slice, slice->curr_mb_addr);
			if (slice->curr_mb_addr >= slice->pic_size_in_mbs) {
				fprintf(stderr, "MB index out of range!\n");
				return 1;
			}
		}
out_cavlc:
		if (vs_end(str)) return 1;
		return 0;
	}
}